

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void monster_swap(loc_conflict grid1,loc_conflict grid2)

{
  loc_conflict grid1_00;
  loc_conflict grid2_00;
  loc_conflict grid2_01;
  player *ppVar1;
  _Bool _Var2;
  wchar_t midx;
  wchar_t midx_00;
  monster *pmVar3;
  loc_conflict pgrid;
  monster *mon;
  wchar_t m2;
  wchar_t m1;
  loc_conflict grid2_local;
  loc_conflict grid1_local;
  
  grid1_00.x = (player->grid).x;
  grid1_00.y = (player->grid).y;
  grid2_local.y = grid1.y;
  grid2_local.x = grid1.x;
  midx = (wchar_t)cave->squares[grid2_local.y][grid2_local.x].mon;
  m1 = grid2.y;
  m2 = grid2.x;
  midx_00 = (wchar_t)cave->squares[m1][m2].mon;
  square_set_mon((chunk *)cave,grid1,midx_00);
  square_set_mon((chunk *)cave,grid2,midx);
  if (midx < L'\x01') {
    if (midx < L'\0') {
      ppVar1 = player;
      (ppVar1->grid).x = grid2.x;
      (ppVar1->grid).y = grid2.y;
      grid2_00.x = (player->grid).x;
      grid2_00.y = (player->grid).y;
      player_leaving(grid1_00,grid2_00);
      player->upkeep->redraw = player->upkeep->redraw | 0x4000;
      player->upkeep->update = player->upkeep->update | 0x1a0;
      player->upkeep->redraw = player->upkeep->redraw | 0x400000;
      cmd_disable_repeat_floor_item();
    }
  }
  else {
    pmVar3 = (monster *)cave_monster(cave,midx);
    _Var2 = monster_is_camouflaged(pmVar3);
    if (_Var2) {
      _Var2 = monster_is_in_view(pmVar3);
      if (((_Var2) ||
          ((L'\xffffffff' < midx_00 && (_Var2 = los(cave,(loc)grid1_00,(loc)grid2), _Var2)))) ||
         ((midx_00 < L'\0' && (_Var2 = los(cave,(loc)grid1,(loc)grid2), _Var2)))) {
        become_aware((chunk *)cave,pmVar3);
      }
      else {
        _Var2 = monster_is_mimicking(pmVar3);
        if (_Var2) {
          move_mimicked_object((chunk *)cave,pmVar3,grid1,grid2);
          player->upkeep->redraw = player->upkeep->redraw | 0x800000;
        }
      }
    }
    pmVar3->grid = grid2;
    update_mon(pmVar3,(chunk *)cave,true);
    if (pmVar3->race->light != L'\0') {
      player->upkeep->update = player->upkeep->update | 0x60;
    }
    player->upkeep->redraw = player->upkeep->redraw | 0x400000;
  }
  if (midx_00 < L'\x01') {
    if (midx_00 < L'\0') {
      ppVar1 = player;
      (ppVar1->grid).x = grid1.x;
      (ppVar1->grid).y = grid1.y;
      grid2_01.x = (player->grid).x;
      grid2_01.y = (player->grid).y;
      player_leaving(grid1_00,grid2_01);
      player->upkeep->redraw = player->upkeep->redraw | 0x4000;
      player->upkeep->update = player->upkeep->update | 0x1a0;
      player->upkeep->redraw = player->upkeep->redraw | 0x400000;
      cmd_disable_repeat_floor_item();
    }
  }
  else {
    pmVar3 = (monster *)cave_monster(cave,midx_00);
    _Var2 = monster_is_camouflaged(pmVar3);
    if (_Var2) {
      _Var2 = monster_is_in_view(pmVar3);
      if (((_Var2) ||
          ((L'\xffffffff' < midx && (_Var2 = los(cave,(loc)grid1_00,(loc)grid1), _Var2)))) ||
         ((midx < L'\0' && (_Var2 = los(cave,(loc)grid2,(loc)grid1), _Var2)))) {
        become_aware((chunk *)cave,pmVar3);
      }
      else {
        _Var2 = monster_is_mimicking(pmVar3);
        if (_Var2) {
          move_mimicked_object((chunk *)cave,pmVar3,grid2,grid1);
          player->upkeep->redraw = player->upkeep->redraw | 0x800000;
        }
      }
    }
    pmVar3->grid = grid1;
    update_mon(pmVar3,(chunk *)cave,true);
    if (pmVar3->race->light != L'\0') {
      player->upkeep->update = player->upkeep->update | 0x60;
    }
    player->upkeep->redraw = player->upkeep->redraw | 0x400000;
  }
  square_light_spot((chunk *)cave,(loc)grid1);
  square_light_spot((chunk *)cave,(loc)grid2);
  return;
}

Assistant:

void monster_swap(struct loc grid1, struct loc grid2)
{
	int m1, m2;
	struct monster *mon;
	struct loc pgrid = player->grid;

	/* Monsters */
	m1 = cave->squares[grid1.y][grid1.x].mon;
	m2 = cave->squares[grid2.y][grid2.x].mon;

	/* Update grids */
	square_set_mon(cave, grid1, m2);
	square_set_mon(cave, grid2, m1);

	/* Monster 1 */
	if (m1 > 0) {
		/* Monster */
		mon = cave_monster(cave, m1);

		/* Update monster */
		if (monster_is_camouflaged(mon)) {
			/*
			 * Become aware if the player can see the grid with
			 * the camouflaged monster before or after the swap.
			 */
			if (monster_is_in_view(mon) ||
				(m2 >= 0 && los(cave, pgrid, grid2)) ||
				(m2 < 0 && los(cave, grid1, grid2))) {
				become_aware(cave, mon);
			} else if (monster_is_mimicking(mon)) {
				move_mimicked_object(cave, mon, grid1, grid2);
				player->upkeep->redraw |= (PR_ITEMLIST);
			}
		}
		mon->grid = grid2;
		update_mon(mon, cave, true);

		/* Affect light? */
		if (mon->race->light != 0)
			player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);
	} else if (m1 < 0) {
		/* Player */
		player->grid = grid2;
		player_leaving(pgrid, player->grid);

		/* Update the trap detection status */
		player->upkeep->redraw |= (PR_DTRAP);

		/* Updates */
		player->upkeep->update |= (PU_PANEL | PU_UPDATE_VIEW | PU_DISTANCE);

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);

		/* Don't allow command repeat if moved away from item used. */
		cmd_disable_repeat_floor_item();
	}

	/* Monster 2 */
	if (m2 > 0) {
		/* Monster */
		mon = cave_monster(cave, m2);

		/* Update monster */
		if (monster_is_camouflaged(mon)) {
			/*
			 * Become aware if the player can see the grid with
			 * the camouflaged monster before or after the swap.
			 */
			if (monster_is_in_view(mon) ||
				(m1 >= 0 && los(cave, pgrid, grid1)) ||
				(m1 < 0 && los(cave, grid2, grid1))) {
				become_aware(cave, mon);
			} else if (monster_is_mimicking(mon)) {
				move_mimicked_object(cave, mon, grid2, grid1);
				player->upkeep->redraw |= (PR_ITEMLIST);
			}
		}
		mon->grid = grid1;
		update_mon(mon, cave, true);

		/* Affect light? */
		if (mon->race->light != 0)
			player->upkeep->update |= PU_UPDATE_VIEW | PU_MONSTERS;

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);
	} else if (m2 < 0) {
		/* Player */
		player->grid = grid1;
		player_leaving(pgrid, player->grid);

		/* Update the trap detection status */
		player->upkeep->redraw |= (PR_DTRAP);

		/* Updates */
		player->upkeep->update |= (PU_PANEL | PU_UPDATE_VIEW | PU_DISTANCE);

		/* Redraw monster list */
		player->upkeep->redraw |= (PR_MONLIST);

		/* Don't allow command repeat if moved away from item used. */
		cmd_disable_repeat_floor_item();
	}

	/* Redraw */
	square_light_spot(cave, grid1);
	square_light_spot(cave, grid2);
}